

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformValue::UniformValue
          (UniformValue *this,UniformType *_type,UniformValueGenerator *generator)

{
  GLenum GVar1;
  pair<int,_int> pVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer piVar5;
  pointer piVar6;
  GLfloat GVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&this->type,_type);
  GVar1 = (this->type).baseType;
  if (GVar1 != 0) {
    pVar2 = (this->type).size;
    iVar9 = pVar2.second;
    iVar8 = pVar2.first;
    if (GVar1 == 0x1404) {
      if (iVar9 != 1) {
        __assert_fail("sizeColumn == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x263,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->iValues,(long)((this->type).arraySize * iVar8));
      piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar12 = 0; (long)piVar6 - (long)piVar5 >> 2 != lVar12; lVar12 = lVar12 + 1) {
        iVar8 = generator->iValue + 1;
        generator->iValue = iVar8;
        piVar5[lVar12] = iVar8;
      }
    }
    else if (GVar1 == 0x1405) {
      if (iVar9 != 1) {
        __assert_fail("sizeColumn == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x26c,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->uValues,(long)((this->type).arraySize * iVar8));
      piVar5 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar12 = 0; (long)piVar6 - (long)piVar5 >> 2 != lVar12; lVar12 = lVar12 + 1) {
        iVar8 = generator->iValue + 1;
        generator->iValue = iVar8;
        piVar5[lVar12] = iVar8;
      }
    }
    else if (GVar1 == 0x1406) {
      std::vector<float,_std::allocator<float>_>::resize
                (&this->fValues,(long)(iVar9 * iVar8 * (this->type).arraySize));
      pfVar3 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar12 = 0; (long)pfVar4 - (long)pfVar3 >> 2 != lVar12; lVar12 = lVar12 + 1) {
        uVar13 = -(uint)(99999.0 < generator->fValue);
        GVar7 = (GLfloat)(uVar13 & 0x3f800000 | ~uVar13 & (uint)(generator->fValue + 1.0));
        generator->fValue = GVar7;
        pfVar3[lVar12] = GVar7;
      }
    }
    else {
      if (GVar1 != 0x82e6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x28c,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<float,_std::allocator<float>_>::resize
                (&this->fValues,(long)((this->type).arraySize << 2));
      pfVar3 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
      for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        pfVar3[uVar11] = (float)uVar11 / (float)uVar10;
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->iValues,(long)(this->type).arraySize);
      piVar5 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar12 = 0; (long)piVar6 - (long)piVar5 >> 2 != lVar12; lVar12 = lVar12 + 1) {
        iVar8 = generator->iValue + 1;
        generator->iValue = iVar8;
        piVar5[lVar12] = iVar8 % 0x10;
      }
    }
  }
  return;
}

Assistant:

UniformValue(const UniformType& _type, UniformValueGenerator& generator) : type(_type)
	{
		const int sizeRow	= type.getSize().first;
		const int sizeColumn = type.getSize().second;

		if (type.isStruct())
		{
			return;
		}

		if (type.getBaseType() == GL_INT)
		{
			assert(sizeColumn == 1);
			iValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI();
			}
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			assert(sizeColumn == 1);
			uValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < uValues.size(); elem++)
			{
				uValues[elem] = static_cast<GLuint>(generator.genI());
			}
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			fValues.resize(sizeColumn * sizeRow * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = generator.genF();
			}
		}
		else if (type.getBaseType() == GL_SAMPLER)
		{
			//color ref value
			fValues.resize(4 * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = float(elem) / float(fValues.size());
			}
			//uniform value
			iValues.resize(type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI() % 16;
			}
		}
		else
		{
			assert(0);
		}
	}